

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

void duckdb::PhysicalOperator::SetEstimatedCardinality
               (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *result,idx_t estimated_cardinality)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  unsigned_long in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"%llu",&local_51);
  StringUtil::Format<unsigned_long>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_88,"__estimated_cardinality__",&local_89);
  this = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ::std::__cxx11::string::operator=((string *)this,local_30);
  ::std::__cxx11::string::~string(local_88);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void PhysicalOperator::SetEstimatedCardinality(InsertionOrderPreservingMap<string> &result,
                                               idx_t estimated_cardinality) {
	result[RenderTreeNode::ESTIMATED_CARDINALITY] = StringUtil::Format("%llu", estimated_cardinality);
}